

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

CURLcode ftp_pl_insert_finfo(connectdata *conn,fileinfo *infop)

{
  Curl_easy *pCVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  code *pcVar8;
  
  pCVar1 = conn->data;
  plVar2 = (long *)(pCVar1->wildcard).tmp;
  lVar3 = *plVar2;
  pcVar4 = (infop->info).b_data;
  lVar5 = *(long *)(lVar3 + 0x28);
  (infop->info).filename = pcVar4 + lVar5;
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x38);
  if (*(long *)(lVar3 + 0x38) == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.group = pcVar7;
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x48);
  if (*(long *)(lVar3 + 0x48) == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.perm = pcVar7;
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x50);
  if (*(long *)(lVar3 + 0x50) == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.target = pcVar7;
  (infop->info).strings.time = pcVar4 + *(long *)(lVar3 + 0x40);
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x30);
  if (*(long *)(lVar3 + 0x30) == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.user = pcVar7;
  pcVar8 = (pCVar1->set).fnmatch;
  if (pcVar8 == (curl_fnmatch_callback)0x0) {
    pcVar8 = Curl_fnmatch;
  }
  iVar6 = (*pcVar8)((pCVar1->set).fnmatch_data,(pCVar1->wildcard).pattern,pcVar4 + lVar5);
  if (iVar6 == 0) {
    if (((infop->info).filetype == CURLFILETYPE_SYMLINK) &&
       (pcVar7 = (infop->info).strings.target, pcVar7 != (char *)0x0)) {
      pcVar7 = strstr(pcVar7," -> ");
      if (pcVar7 != (char *)0x0) goto LAB_0058a157;
    }
    Curl_llist_insert_next
              (&(pCVar1->wildcard).filelist,(pCVar1->wildcard).filelist.tail,infop,&infop->list);
  }
  else {
LAB_0058a157:
    Curl_fileinfo_dtor((void *)0x0,infop);
  }
  lVar3 = *plVar2;
  *(undefined8 *)(lVar3 + 0x10) = 0;
  return (CURLcode)lVar3;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct connectdata *conn,
                                    struct fileinfo *infop)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &conn->data->wildcard;
  struct ftp_wc_tmpdata *tmpdata = wc->tmp;
  struct curl_llist *llist = &wc->filelist;
  struct ftp_parselist_data *parser = tmpdata->parser;
  bool add = TRUE;
  struct curl_fileinfo *finfo = &infop->info;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = conn->data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  if(compare(conn->data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }

  if(add) {
    Curl_llist_insert_next(llist, llist->tail, finfo, &infop->list);
  }
  else {
    Curl_fileinfo_dtor(NULL, finfo);
  }

  tmpdata->parser->file_data = NULL;
  return CURLE_OK;
}